

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O2

void __thiscall
deqp::egl::ConfigFilter::setValues
          (ConfigFilter *this,
          vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
          *values)

{
  pointer ppVar1;
  size_t ndx;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppVar1 = (values->
               super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(values->
                            super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 3);
      uVar2 = uVar2 + 1) {
    setValue(this,ppVar1[uVar2].first,ppVar1[uVar2].second);
  }
  return;
}

Assistant:

void setValues (std::vector<std::pair<EGLenum, EGLint> > values)
	{
		for (size_t ndx = 0; ndx < values.size(); ndx++)
		{
			const EGLenum	name	= values[ndx].first;
			const EGLint	value	= values[ndx].second;

			setValue(name, value);
		}
	}